

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11GlxPlatform.cpp
# Opt level: O0

void __thiscall tcu::x11::glx::GlxRenderContext::~GlxRenderContext(GlxRenderContext *this)

{
  Display *pDVar1;
  GlxRenderContext *this_local;
  
  (this->super_RenderContext)._vptr_RenderContext = (_func_int **)&PTR__GlxRenderContext_003ff550;
  clearCurrent(this);
  if (this->m_GLXContext != (GLXContext)0x0) {
    pDVar1 = XlibDisplay::getXDisplay(&(this->m_glxDisplay).super_XlibDisplay);
    glXDestroyContext(pDVar1,this->m_GLXContext);
  }
  RenderTarget::~RenderTarget(&this->m_renderTarget);
  de::details::
  UniquePtr<tcu::x11::glx::GlxDrawable,_de::DefaultDeleter<tcu::x11::glx::GlxDrawable>_>::~UniquePtr
            (&this->m_glxDrawable);
  GlxDisplay::~GlxDisplay(&this->m_glxDisplay);
  glu::RenderContext::~RenderContext(&this->super_RenderContext);
  return;
}

Assistant:

GlxRenderContext::~GlxRenderContext (void)
{
	clearCurrent();
	if (m_GLXContext != DE_NULL)
		glXDestroyContext(m_glxDisplay.getXDisplay(), m_GLXContext);
}